

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_Mesh * __thiscall
ON_Mesh::CopyComponents
          (ON_Mesh *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count,ON_Mesh *destination_mesh)

{
  ON_COMPONENT_INDEX *pOVar1;
  double *pdVar2;
  uint mesh_vertex_count;
  uint count;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ON_MeshTopologyEdge *pOVar7;
  ON_MeshTopologyVertex *pOVar8;
  ON_MeshFace *pOVar9;
  undefined8 uVar10;
  double dVar11;
  float fVar12;
  bool bVar13;
  uint uVar14;
  uint *puVar15;
  uint *puVar16;
  ulong uVar17;
  ON_MeshFace *pOVar18;
  ON_3fVector *pOVar19;
  ON_3fPoint *pOVar20;
  ON_3dPoint *pOVar21;
  ON_2dPoint *pOVar22;
  ON_3fVector *pOVar23;
  ON_2fPoint *pOVar24;
  ON_SurfaceCurvature *pOVar25;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar26;
  ON_MeshNgon *pOVar27;
  ON_MeshNgon *ngon;
  uint *puVar28;
  ulong uVar29;
  int j;
  long lVar30;
  uint uVar31;
  size_t ci_index;
  size_t sVar32;
  long lVar33;
  ON_SurfaceCurvature *pOVar34;
  ON_COMPONENT_INDEX ci;
  ON_SimpleArray<unsigned_int> vertex_map_buffer;
  ON_SimpleArray<unsigned_int> face_map_buffer;
  ON_MeshNgonBuffer ngon_buffer;
  ON_SurfaceCurvature *local_148;
  ON_SurfaceCurvature *local_140;
  ON_MeshTopology *local_130;
  ON_SurfaceCurvature *local_128;
  ON_3dPoint *local_120;
  undefined1 local_108 [12];
  int iStack_fc;
  ON_SimpleArray<ON_3fPoint> *local_f0;
  ON_3fPoint *local_e8;
  ON_SimpleArray<unsigned_int> local_e0;
  ON_SimpleArray<ON_Color> *local_c8;
  ON_SimpleArray<ON_SurfaceCurvature> *local_c0;
  ON_SimpleArray<ON_2fPoint> *local_b8;
  ON_SimpleArray<ON_3fVector> *local_b0;
  ON_SimpleArray<ON_2dPoint> *local_a8;
  ON_SimpleArray<ON_3dPoint> *local_a0;
  ON_SimpleArray<unsigned_int> local_98;
  ON_MeshNgonBuffer local_80;
  
  if (ci_list == (ON_COMPONENT_INDEX *)0x0 || ci_count == 0) {
    return (ON_Mesh *)0x0;
  }
  mesh_vertex_count = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  count = (this->m_F).m_count;
  uVar14 = 0;
  if (count == 0 && mesh_vertex_count == 0) {
    return (ON_Mesh *)0x0;
  }
  if ((this->m_top).m_b32IsValid == 1) {
    local_130 = Topology(this);
    uVar14 = (local_130->m_topv).m_count;
    uVar31 = (local_130->m_tope).m_count;
  }
  else {
    local_130 = (ON_MeshTopology *)0x0;
    uVar31 = 0;
  }
  local_e0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
  local_e0.m_a = (uint *)0x0;
  local_e0.m_count = 0;
  local_e0.m_capacity = 0;
  local_98._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
  local_98.m_a = (uint *)0x0;
  local_98.m_count = 0;
  local_98.m_capacity = 0;
  ON_MeshNgonBuffer::ON_MeshNgonBuffer(&local_80);
  puVar15 = (uint *)0x0;
  puVar16 = (uint *)0x0;
  for (sVar32 = 0; sVar32 != ci_count; sVar32 = sVar32 + 1) {
    local_108._0_8_ = ci_list[sVar32];
    bVar13 = ON_COMPONENT_INDEX::IsMeshComponentIndex((ON_COMPONENT_INDEX *)local_108);
    if (bVar13) {
      lVar30 = (long)(int)local_108._4_4_;
      if (-1 < lVar30) {
        switch(local_108._0_4_) {
        case 0xb:
          if ((uint)local_108._4_4_ < mesh_vertex_count) {
            if (puVar16 == (uint *)0x0) {
              puVar16 = InitializeMap(mesh_vertex_count,&local_e0);
            }
            puVar16[lVar30] = 0;
          }
          break;
        case 0xc:
          if (((uint)local_108._4_4_ < uVar14) &&
             (pOVar8 = (local_130->m_topv).m_a, pOVar8[lVar30].m_vi != (int *)0x0)) {
            for (lVar33 = 0; lVar33 < pOVar8[lVar30].m_v_count; lVar33 = lVar33 + 1) {
              uVar4 = pOVar8[lVar30].m_vi[lVar33];
              if (uVar4 < mesh_vertex_count && -1 < (int)uVar4) {
                if (puVar16 == (uint *)0x0) {
                  puVar16 = InitializeMap(mesh_vertex_count,&local_e0);
                }
                puVar16[uVar4] = 0;
              }
            }
          }
          break;
        case 0xd:
          if (((uint)local_108._4_4_ < uVar31) &&
             (pOVar7 = (local_130->m_tope).m_a, pOVar7[lVar30].m_topfi != (int *)0x0)) {
            for (lVar33 = 0; lVar33 < pOVar7[lVar30].m_topf_count; lVar33 = lVar33 + 1) {
              uVar4 = pOVar7[lVar30].m_topfi[lVar33];
              if (uVar4 < count && -1 < (int)uVar4) {
                if (puVar15 == (uint *)0x0) {
                  puVar15 = InitializeMap(count,&local_98);
                }
                puVar15[uVar4] = 0;
              }
            }
          }
          break;
        case 0xe:
        case 0xf:
          pOVar27 = NgonFromComponentIndex(this,&local_80,(ON_COMPONENT_INDEX)local_108._0_8_);
          if (pOVar27 != (ON_MeshNgon *)0x0) {
            if (pOVar27->m_vi != (uint *)0x0) {
              for (uVar29 = 0; uVar29 < pOVar27->m_Vcount; uVar29 = uVar29 + 1) {
                uVar4 = pOVar27->m_vi[uVar29];
                if (uVar4 < mesh_vertex_count) {
                  if (puVar16 == (uint *)0x0) {
                    puVar16 = InitializeMap(mesh_vertex_count,&local_e0);
                  }
                  puVar16[uVar4] = 0;
                }
              }
            }
            if (pOVar27->m_fi != (uint *)0x0) {
              for (uVar29 = 0; uVar29 < pOVar27->m_Fcount; uVar29 = uVar29 + 1) {
                uVar4 = pOVar27->m_fi[uVar29];
                if (uVar4 < count) {
                  if (puVar15 == (uint *)0x0) {
                    puVar15 = InitializeMap(count,&local_98);
                  }
                  puVar15[uVar4] = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  if (puVar15 == (uint *)0x0) {
    sVar32 = 0;
  }
  else {
    sVar32 = 0;
    for (lVar30 = 0; (ulong)count * 4 - lVar30 != 0; lVar30 = lVar30 + 4) {
      if (*(int *)((long)puVar15 + lVar30) == 0) {
        pOVar1 = (ON_COMPONENT_INDEX *)(((this->m_F).m_a)->vi + lVar30);
        local_108._0_8_ = *pOVar1;
        unique0x100005ad = pOVar1[1];
        bVar13 = ON_MeshFace::IsValid((ON_MeshFace *)local_108,mesh_vertex_count);
        if (bVar13) {
          *(int *)((long)puVar15 + lVar30) = (int)sVar32;
          if (puVar16 == (uint *)0x0) {
            puVar16 = InitializeMap(mesh_vertex_count,&local_e0);
          }
          sVar32 = (size_t)((int)sVar32 + 1);
          puVar16[(int)local_108._0_4_] = 0;
          puVar16[(int)local_108._4_4_] = 0;
          puVar16[(int)local_108._8_4_] = 0;
          puVar16[iStack_fc] = 0;
        }
        else {
          *(undefined4 *)((long)puVar15 + lVar30) = 0xffffffff;
        }
      }
    }
  }
  uVar29 = 0;
  if (puVar16 != (uint *)0x0) {
    for (uVar17 = 0; uVar14 = (uint)uVar29, mesh_vertex_count != uVar17; uVar17 = uVar17 + 1) {
      if (puVar16[uVar17] == 0) {
        puVar16[uVar17] = uVar14;
        uVar29 = (ulong)(uVar14 + 1);
      }
    }
    if (uVar14 != 0) {
      if (destination_mesh == (ON_Mesh *)0x0) {
        destination_mesh = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh(destination_mesh);
      }
      else {
        Destroy(destination_mesh);
      }
      local_f0 = (ON_SimpleArray<ON_3fPoint> *)uVar29;
      if ((int)sVar32 != 0) {
        pOVar9 = (this->m_F).m_a;
        ON_SimpleArray<ON_MeshFace>::Reserve(&destination_mesh->m_F,sVar32);
        iVar3 = (this->m_F).m_count;
        pOVar23 = (ON_3fVector *)0x0;
        bVar13 = true;
        if ((0 < iVar3) &&
           (bVar13 = true, (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar3)) {
          pOVar23 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a;
          if (pOVar23 == (ON_3fVector *)0x0) {
            pOVar23 = (ON_3fVector *)0x0;
          }
          else {
            ON_SimpleArray<ON_3fVector>::Reserve
                      (&(destination_mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,sVar32);
            bVar13 = false;
          }
        }
        for (lVar30 = 0; (ulong)count * 4 - lVar30 != 0; lVar30 = lVar30 + 4) {
          if (*(int *)((long)puVar15 + lVar30) != -1) {
            pOVar18 = ON_SimpleArray<ON_MeshFace>::AppendNew(&destination_mesh->m_F);
            pOVar18->vi[0] = puVar16[(uint)pOVar9->vi[lVar30]];
            pOVar18->vi[1] = puVar16[(uint)pOVar9->vi[lVar30 + 1]];
            pOVar18->vi[2] = puVar16[(uint)pOVar9->vi[lVar30 + 2]];
            pOVar18->vi[3] = puVar16[(uint)pOVar9->vi[lVar30 + 3]];
            if (!bVar13) {
              pOVar19 = ON_SimpleArray<ON_3fVector>::AppendNew
                                  (&(destination_mesh->m_FN).super_ON_SimpleArray<ON_3fVector>);
              pOVar19->z = pOVar23->z;
              fVar12 = pOVar23->y;
              pOVar19->x = pOVar23->x;
              pOVar19->y = fVar12;
            }
          }
          pOVar23 = pOVar23 + 1;
        }
      }
      iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      pOVar25 = (ON_SurfaceCurvature *)0x0;
      local_120 = (ON_3dPoint *)0x0;
      if (iVar3 == (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count) {
        local_120 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
      }
      local_140 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar3) {
        local_140 = (ON_SurfaceCurvature *)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
      }
      local_128 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar3) {
        local_128 = (ON_SurfaceCurvature *)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
      }
      local_148 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar3) {
        local_148 = (ON_SurfaceCurvature *)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      }
      local_130 = (ON_MeshTopology *)0x0;
      if ((this->m_K).m_count == iVar3) {
        local_130 = (ON_MeshTopology *)(this->m_K).m_a;
      }
      local_e8 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      pOVar34 = (ON_SurfaceCurvature *)0x0;
      if ((this->m_C).m_count == iVar3) {
        pOVar34 = (ON_SurfaceCurvature *)(this->m_C).m_a;
      }
      if (iVar3 < 1) {
        pOVar34 = pOVar25;
        local_148 = pOVar25;
        local_140 = pOVar25;
        local_128 = pOVar25;
        local_130 = (ON_MeshTopology *)pOVar25;
      }
      uVar29 = (ulong)local_f0 & 0xffffffff;
      if (local_e8 != (ON_3fPoint *)0x0) {
        ON_SimpleArray<ON_3fPoint>::Reserve
                  (&(destination_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,uVar29);
      }
      if (local_120 != (ON_3dPoint *)0x0) {
        ON_SimpleArray<ON_3dPoint>::Reserve
                  (&(destination_mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>,uVar29);
      }
      if (local_140 != (ON_SurfaceCurvature *)0x0) {
        ON_SimpleArray<ON_2dPoint>::Reserve
                  (&(destination_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,uVar29);
      }
      if (local_128 != (ON_SurfaceCurvature *)0x0) {
        ON_SimpleArray<ON_3fVector>::Reserve
                  (&(destination_mesh->m_N).super_ON_SimpleArray<ON_3fVector>,uVar29);
      }
      if (local_148 != (ON_SurfaceCurvature *)0x0) {
        ON_SimpleArray<ON_2fPoint>::Reserve
                  (&(destination_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,uVar29);
      }
      if (local_130 != (ON_MeshTopology *)0x0) {
        ON_SimpleArray<ON_SurfaceCurvature>::Reserve(&destination_mesh->m_K,uVar29);
      }
      if (pOVar34 != (ON_SurfaceCurvature *)0x0) {
        ON_SimpleArray<ON_Color>::Reserve(&destination_mesh->m_C,uVar29);
      }
      local_f0 = &(destination_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>;
      local_a0 = &(destination_mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>;
      local_a8 = &(destination_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>;
      local_b0 = &(destination_mesh->m_N).super_ON_SimpleArray<ON_3fVector>;
      local_b8 = &(destination_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>;
      local_c0 = &destination_mesh->m_K;
      local_c8 = &destination_mesh->m_C;
      lVar30 = 0;
      for (lVar33 = 0; (ulong)mesh_vertex_count * 4 - lVar33 != 0; lVar33 = lVar33 + 4) {
        if (*(int *)((long)puVar16 + lVar33) != -1) {
          if (local_e8 != (ON_3fPoint *)0x0) {
            pOVar20 = ON_SimpleArray<ON_3fPoint>::AppendNew(local_f0);
            pOVar20->z = *(float *)((long)&local_e8->z + lVar30);
            uVar10 = *(undefined8 *)((long)&local_e8->x + lVar30);
            pOVar20->x = (float)(int)uVar10;
            pOVar20->y = (float)(int)((ulong)uVar10 >> 0x20);
          }
          if (local_120 != (ON_3dPoint *)0x0) {
            pOVar21 = ON_SimpleArray<ON_3dPoint>::AppendNew(local_a0);
            pOVar21->z = *(double *)((long)&local_120->z + lVar30 * 2);
            pdVar2 = (double *)((long)&local_120->x + lVar30 * 2);
            dVar11 = pdVar2[1];
            pOVar21->x = *pdVar2;
            pOVar21->y = dVar11;
          }
          if (local_140 != (ON_SurfaceCurvature *)0x0) {
            pOVar22 = ON_SimpleArray<ON_2dPoint>::AppendNew(local_a8);
            pdVar2 = (double *)((long)&local_140->k1 + lVar33 * 4);
            dVar11 = pdVar2[1];
            pOVar22->x = *pdVar2;
            pOVar22->y = dVar11;
          }
          if (local_128 != (ON_SurfaceCurvature *)0x0) {
            pOVar23 = ON_SimpleArray<ON_3fVector>::AppendNew(local_b0);
            pOVar23->z = *(float *)((long)&local_128->k2 + lVar30);
            uVar10 = *(undefined8 *)((long)&local_128->k1 + lVar30);
            pOVar23->x = (float)(int)uVar10;
            pOVar23->y = (float)(int)((ulong)uVar10 >> 0x20);
          }
          if (local_148 != (ON_SurfaceCurvature *)0x0) {
            pOVar24 = ON_SimpleArray<ON_2fPoint>::AppendNew(local_b8);
            *pOVar24 = *(ON_2fPoint *)((long)&local_148->k1 + lVar33 * 2);
          }
          if (local_130 != (ON_MeshTopology *)0x0) {
            pOVar25 = ON_SimpleArray<ON_SurfaceCurvature>::AppendNew(local_c0);
            pdVar2 = (double *)((long)&((ON_SurfaceCurvature *)local_130)->k1 + lVar33 * 4);
            dVar11 = pdVar2[1];
            pOVar25->k1 = *pdVar2;
            pOVar25->k2 = dVar11;
          }
          if (pOVar34 != (ON_SurfaceCurvature *)0x0) {
            paVar26 = &ON_SimpleArray<ON_Color>::AppendNew(local_c8)->field_0;
            *paVar26 = *(anon_union_4_2_6147a14e_for_ON_Color_15 *)((long)&pOVar34->k1 + lVar33);
          }
        }
        lVar30 = lVar30 + 0xc;
      }
      uVar14 = NgonCount(this);
      for (uVar31 = 0; uVar31 != uVar14; uVar31 = uVar31 + 1) {
        pOVar27 = Ngon(this,uVar31);
        if (pOVar27 != (ON_MeshNgon *)0x0) {
          uVar4 = pOVar27->m_Vcount;
          if (((ulong)uVar4 != 0) && (pOVar27->m_vi != (uint *)0x0)) {
            uVar5 = pOVar27->m_Fcount;
            if (((ulong)uVar5 != 0) && (pOVar27->m_fi != (uint *)0x0)) {
              uVar29 = 0;
              do {
                if (uVar4 == uVar29) {
                  uVar29 = 0;
                  goto LAB_0052943a;
                }
                uVar6 = pOVar27->m_vi[uVar29];
              } while ((uVar6 < mesh_vertex_count) &&
                      (uVar29 = uVar29 + 1, puVar16[uVar6] != 0xffffffff));
            }
          }
        }
LAB_005294e6:
      }
      goto LAB_00528f18;
    }
  }
  destination_mesh = (ON_Mesh *)0x0;
LAB_00528f18:
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_98);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_e0);
  return destination_mesh;
LAB_0052943a:
  if (uVar5 != uVar29) goto code_r0x0052943f;
  ngon = AllocateNgon(destination_mesh,uVar4,uVar5);
  ngon->m_Vcount = 0;
  ngon->m_Fcount = 0;
  for (uVar29 = 0; uVar29 < pOVar27->m_Vcount; uVar29 = uVar29 + 1) {
    uVar4 = puVar16[pOVar27->m_vi[uVar29]];
    uVar5 = ngon->m_Vcount;
    ngon->m_Vcount = uVar5 + 1;
    ngon->m_vi[uVar5] = uVar4;
  }
  for (uVar29 = 0; uVar29 < pOVar27->m_Fcount; uVar29 = uVar29 + 1) {
    uVar4 = puVar15[pOVar27->m_fi[uVar29]];
    uVar5 = ngon->m_Fcount;
    ngon->m_Fcount = uVar5 + 1;
    ngon->m_fi[uVar5] = uVar4;
  }
  AddNgon(destination_mesh,ngon);
  puVar28 = NgonMap(this);
  if (puVar28 != (uint *)0x0) {
    CreateNgonMap(destination_mesh);
  }
  goto LAB_005294e6;
code_r0x0052943f:
  uVar6 = pOVar27->m_fi[uVar29];
  if ((count <= uVar6) || (uVar29 = uVar29 + 1, puVar15[uVar6] == 0xffffffff)) goto LAB_005294e6;
  goto LAB_0052943a;
}

Assistant:

ON_Mesh* ON_Mesh::CopyComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count,
  class ON_Mesh* destination_mesh
  ) const
{
  if ( ci_count <= 0 || 0 == ci_list )
    return 0;

  const unsigned int vertex_count = m_V.UnsignedCount();
  const unsigned int face_count = m_F.UnsignedCount();

  if ( vertex_count <= 0 && face_count <= 0 )
    return 0;

  const ON_MeshTopology* top = TopologyExists() ? &Topology() : 0;
  const unsigned int topv_count = top ? top->m_topv.UnsignedCount() : 0;
  const unsigned int tope_count = top ? top->m_tope.UnsignedCount() : 0;
  
  ON_SimpleArray< unsigned int > vertex_map_buffer;
  ON_SimpleArray< unsigned int > face_map_buffer;

  unsigned int* vertex_map = 0;
  unsigned int* face_map = 0;
  unsigned int i, fi, vi;

  ON_MeshNgonBuffer ngon_buffer;
  
  for ( size_t ci_index = 0; ci_index < ci_count; ci_index++ )
  {
    ON_COMPONENT_INDEX ci = ci_list[ci_index];
    if ( !ci.IsMeshComponentIndex() )
      continue;
    if ( ci.m_index < 0 )
      continue;
    i = (unsigned int)ci.m_index;

    switch(ci.m_type)
    {
    case ON_COMPONENT_INDEX::mesh_vertex:
      if ( i >= vertex_count )
        break;
      if ( 0 == vertex_map )
        vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
      vertex_map[i] = 0;
      break;

    case ON_COMPONENT_INDEX::mesh_face:
    case ON_COMPONENT_INDEX::mesh_ngon:
      {
        const ON_MeshNgon* ngon = NgonFromComponentIndex(ngon_buffer,ci);
        if ( 0 == ngon )
          break;
        if ( 0 != ngon->m_vi )
        {
          for ( i = 0; i < ngon->m_Vcount; i++ )
          {
            vi = ngon->m_vi[i];
            if ( vi >= vertex_count )
              continue;
            if ( 0 == vertex_map )
              vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
            vertex_map[vi] = 0;
          }
        }
        if ( 0 != ngon->m_fi )
        {
          for ( i = 0; i < ngon->m_Fcount; i++ )
          {
            fi = ngon->m_fi[i];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_vertex:
      if ( i < topv_count )
      {
        const ON_MeshTopologyVertex& v = top->m_topv[i];
        if ( v.m_vi )
        {
          for ( int j = 0; j < v.m_v_count; j++ )
          {
            if ( v.m_vi[j] < 0 )
              continue;
            vi = (unsigned int)v.m_vi[j];
            if ( vi < vertex_count )
            {
              if ( 0 == vertex_map )
                vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
              vertex_map[vi] = 0;
            }
          }
        }
      }
      break;

    case ON_COMPONENT_INDEX::meshtop_edge:
      if ( i < tope_count )
      {
        const ON_MeshTopologyEdge& e = top->m_tope[i];
        if ( e.m_topfi )
        {
          for ( int j = 0; j < e.m_topf_count; j++ )
          {
            if ( e.m_topfi[j] < 0 )
              continue;
            fi = (unsigned int)e.m_topfi[j];
            if ( fi >= face_count )
              continue;
            if ( 0 == face_map )
              face_map = InitializeMap(face_count,face_map_buffer);
            face_map[fi] = 0;
          }
        }
      }
      break;

    default:
      break;
    }
  }

  unsigned int face_count1 = 0;
  if ( 0 != face_map )
  {
    for ( i = 0; i < face_count; i++ )
    {
      if ( 0 == face_map[i] )
      {
        ON_MeshFace f = m_F[i];
        if ( f.IsValid(vertex_count) )
        {
          face_map[i] = face_count1++;
          if ( 0 == vertex_map )
            vertex_map = InitializeMap(vertex_count,vertex_map_buffer);
          vertex_map[f.vi[0]] = 0;
          vertex_map[f.vi[1]] = 0;
          vertex_map[f.vi[2]] = 0;
          vertex_map[f.vi[3]] = 0;
        }
        else
          face_map[i] = ON_UNSET_UINT_INDEX; // bogus input face
      }
    }
  }

  if ( 0 == vertex_map )
    return 0;

  unsigned int vertex_count1 = 0;
  for ( i = 0; i < vertex_count; i++ )
  {
    if ( 0 == vertex_map[i] )
      vertex_map[i] = vertex_count1++;
  }

  if ( vertex_count1 <= 0 )
    return 0;

  ON_Mesh* mesh_copy = 0;
  if ( destination_mesh )
  {
    destination_mesh->Destroy();
    mesh_copy = destination_mesh;
  }
  else
  {
    mesh_copy = new ON_Mesh();
  }

  if ( face_count1 > 0 )
  {
    // copy face information
    const ON_MeshFace* F = m_F.Array();
    mesh_copy->m_F.Reserve(face_count1);
    const ON_3fVector* FN = HasFaceNormals() ? m_FN.Array() : 0;
    if ( 0 != FN )
      mesh_copy->m_FN.Reserve(face_count1);
    const unsigned int* fvi;
    unsigned int* fvi1;
    for ( fi = 0; fi < face_count; fi++ )
    {
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        continue;
      fvi = (const unsigned int*)F[fi].vi;
      fvi1 = (unsigned int*)(mesh_copy->m_F.AppendNew().vi);
      fvi1[0] = vertex_map[fvi[0]];
      fvi1[1] = vertex_map[fvi[1]];
      fvi1[2] = vertex_map[fvi[2]];
      fvi1[3] = vertex_map[fvi[3]];
      if ( FN )
        mesh_copy->m_FN.AppendNew() = FN[fi];
    }
  }

  const bool bValidSingles = (VertexUnsignedCount() == m_V.UnsignedCount());
  const ON_3fPoint* fV = bValidSingles ? m_V.Array() : nullptr;
  const bool bValidDoubles = (VertexUnsignedCount() == m_dV.UnsignedCount());
  const ON_3dPoint* dV = bValidDoubles ? m_dV.Array() : nullptr;
  const ON_2dPoint* S = HasSurfaceParameters() ? m_S.Array() : 0;
  const ON_3fVector* N = HasVertexNormals() ? m_N.Array() : 0;
  const ON_2fPoint* T = HasTextureCoordinates() ? m_T.Array() : 0;
  const ON_SurfaceCurvature* K = HasPrincipalCurvatures() ? m_K.Array() : 0;
  const ON_Color* C = HasVertexColors() ? m_C.Array() : 0;

  if (fV)
    mesh_copy->m_V.Reserve(vertex_count1);
  if (dV)
    mesh_copy->m_dV.Reserve(vertex_count1);
  if (S)
    mesh_copy->m_S.Reserve(vertex_count1);
  if (N)
    mesh_copy->m_N.Reserve(vertex_count1);
  if (T)
    mesh_copy->m_T.Reserve(vertex_count1);
  if (K)
    mesh_copy->m_K.Reserve(vertex_count1);
  if (C)
    mesh_copy->m_C.Reserve(vertex_count1);

  for ( vi = 0; vi < vertex_count; vi++ )
  {
    if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
      continue;
    if (fV)
      mesh_copy->m_V.AppendNew() = fV[vi];
    if (dV)
      mesh_copy->m_dV.AppendNew() = dV[vi];
    if ( S )
      mesh_copy->m_S.AppendNew() = S[vi];
    if ( N )
      mesh_copy->m_N.AppendNew() = N[vi];
    if ( T )
      mesh_copy->m_T.AppendNew() = T[vi];
    if ( K )
      mesh_copy->m_K.AppendNew() = K[vi];
    if ( C )
      mesh_copy->m_C.AppendNew() = C[vi];
  }

  const unsigned int ngon_count = NgonCount();
  for ( unsigned int ngon_index = 0; ngon_index < ngon_count; ngon_index++ )
  {
    const ON_MeshNgon* ngon = Ngon(ngon_index);
    if ( 0 == ngon )
      continue;
    if ( 0 == ngon->m_Vcount || 0 == ngon->m_vi )
      continue;
    if ( 0 == ngon->m_Fcount || 0 == ngon->m_fi )
      continue;
    
    unsigned int j;
    
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      vi = ngon->m_vi[j];
      if ( vi >= vertex_count )
        break;
      if ( ON_UNSET_UINT_INDEX == vertex_map[vi] )
        break;
    }
    if ( j < ngon->m_Vcount )
      continue;

    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      fi = ngon->m_fi[j];
      if ( fi >= face_count )
        break;
      if ( ON_UNSET_UINT_INDEX == face_map[fi] )
        break;
    }
    if ( j < ngon->m_Fcount )
      continue;

    ON_MeshNgon* ngon1 = mesh_copy->AllocateNgon(ngon->m_Vcount,ngon->m_Fcount);

    ngon1->m_Vcount = 0;
    ngon1->m_Fcount = 0;
    for ( j = 0; j < ngon->m_Vcount; j++ )
    {
      ngon1->m_vi[ngon1->m_Vcount++] = vertex_map[ngon->m_vi[j]];
    }
    for ( j = 0; j < ngon->m_Fcount; j++ )
    {
      ngon1->m_fi[ngon1->m_Fcount++] = face_map[ngon->m_fi[j]];
    }

    mesh_copy->AddNgon(ngon1);

    if ( 0 != NgonMap() )
      mesh_copy->CreateNgonMap();
  }

  return mesh_copy;
}